

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,string *out)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  char *__s;
  long *plVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  byte *pbVar12;
  bool bVar13;
  char cVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint __len;
  size_type *local_a0;
  string tmp;
  size_type *local_78;
  string __str;
  long *local_50;
  long local_40;
  long lStack_38;
  
  __str.field_2._8_8_ = this;
  __s = GetOidString(this->oidIndex);
  if (__s != (char *)0x0) {
    pcVar2 = (char *)out->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar2,(ulong)__s);
  }
  local_a0 = &tmp._M_string_length;
  tmp._M_dataplus._M_p = (pointer)0x0;
  tmp._M_string_length._0_1_ = 0;
  pbVar3 = *(byte **)(__str.field_2._8_8_ + 0x10);
  if (*(byte **)(__str.field_2._8_8_ + 0x18) == pbVar3) {
    bVar13 = false;
    goto LAB_00139317;
  }
  if (*pbVar3 < 0x28) {
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x13efd8);
    bVar1 = **(byte **)(__str.field_2._8_8_ + 0x10);
    uVar19 = 1;
    if (9 < bVar1) {
      uVar19 = 3 - (bVar1 < 100);
    }
    local_78 = &__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar19);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar19,(uint)bVar1);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x13ef79);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_40 = *plVar8;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar8;
      local_50 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_50);
    tmp.field_2._8_8_ = out;
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
LAB_00139116:
    if (local_78 != &__str._M_string_length) {
      operator_delete(local_78);
    }
    uVar17 = 1;
  }
  else {
    if (*pbVar3 < 0x50) {
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x140635);
      uVar18 = **(byte **)(__str.field_2._8_8_ + 0x10) - 0x28;
      uVar19 = -uVar18;
      if (0 < (int)uVar18) {
        uVar19 = uVar18;
      }
      __len = 1;
      if (9 < uVar19) {
        __len = 3 - (uVar19 < 100);
      }
      local_78 = &__str._M_string_length;
      tmp.field_2._8_8_ = out;
      std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)((int)uVar18 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar18 >> 0x1f) + (long)local_78),__len,uVar19);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x13ef79);
      plVar5 = puVar7 + 2;
      if ((long *)*puVar7 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*puVar7;
      }
      *puVar7 = plVar5;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      goto LAB_00139116;
    }
    pbVar12 = *(byte **)(__str.field_2._8_8_ + 0x18) + ~(ulong)pbVar3;
    pbVar9 = (byte *)0x5;
    if (pbVar12 < (byte *)0x5) {
      pbVar9 = pbVar12;
    }
    iVar11 = (int)pbVar9 + 1;
    pbVar12 = (byte *)0x0;
    uVar10 = 0;
    do {
      uVar10 = pbVar3[(long)pbVar12] & 0x7f | uVar10;
      if (-1 < (char)pbVar3[(long)pbVar12]) {
        iVar11 = (int)pbVar12;
        break;
      }
      uVar10 = uVar10 << 7;
      pbVar12 = pbVar12 + 1;
    } while (pbVar9 + 1 != pbVar12);
    uVar17 = (ulong)(iVar11 + 1);
    bVar13 = false;
    if ((uVar10 >> 0x20 != 0 || iVar11 == 6) || (uVar10 < 0x50)) goto LAB_00139317;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x140689);
    uVar10 = uVar10 - 0x50;
    cVar14 = '\x01';
    if (9 < uVar10) {
      uVar15 = uVar10;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (uVar15 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00139340;
        }
        if (uVar15 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00139340;
        }
        if (uVar15 < 10000) goto LAB_00139340;
        bVar13 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar13);
      cVar14 = cVar14 + '\x01';
    }
LAB_00139340:
    tmp.field_2._8_8_ = out;
    local_78 = &__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)&local_78,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_78,(uint)__str._M_dataplus._M_p,uVar10);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x13ef79);
    plVar5 = puVar7 + 2;
    if ((long *)*puVar7 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*puVar7;
    }
    *puVar7 = plVar5;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_78 != &__str._M_string_length) {
      operator_delete(local_78);
    }
  }
  lVar6 = *(long *)(__str.field_2._8_8_ + 0x10);
  uVar10 = *(long *)(__str.field_2._8_8_ + 0x18) - lVar6;
  if (uVar17 < uVar10) {
    do {
      uVar10 = uVar10 - 1;
      if (4 < uVar10) {
        uVar10 = 5;
      }
      iVar11 = (int)uVar10 + 1;
      lVar16 = 0;
      uVar15 = 0;
      do {
        bVar1 = *(byte *)(lVar6 + uVar17 + lVar16);
        uVar15 = bVar1 & 0x7f | uVar15;
        if (-1 < (char)bVar1) {
          iVar11 = (int)lVar16;
          break;
        }
        uVar15 = uVar15 << 7;
        lVar16 = lVar16 + 1;
      } while (uVar10 + 1 != lVar16);
      if (uVar15 >> 0x20 != 0 || iVar11 == 6) {
        bVar13 = false;
        goto LAB_00139317;
      }
      cVar14 = '\x01';
      if (9 < uVar15) {
        uVar10 = uVar15;
        cVar4 = '\x04';
        do {
          cVar14 = cVar4;
          if (uVar10 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_00139212;
          }
          if (uVar10 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_00139212;
          }
          if (uVar10 < 10000) goto LAB_00139212;
          bVar13 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar4 = cVar14 + '\x04';
        } while (bVar13);
        cVar14 = cVar14 + '\x01';
      }
LAB_00139212:
      local_78 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78,(uint)__str._M_dataplus._M_p,uVar15);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x13ef79);
      plVar5 = puVar7 + 2;
      if ((long *)*puVar7 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*puVar7;
      }
      *puVar7 = plVar5;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_78 != &__str._M_string_length) {
        operator_delete(local_78);
      }
      uVar17 = uVar17 + (iVar11 + 1);
      lVar6 = *(long *)(__str.field_2._8_8_ + 0x10);
      uVar10 = *(long *)(__str.field_2._8_8_ + 0x18) - lVar6;
    } while (uVar17 < uVar10);
  }
  std::__cxx11::string::swap((string *)tmp.field_2._8_8_);
  bVar13 = true;
LAB_00139317:
  if (local_a0 != &tmp._M_string_length) {
    operator_delete(local_a0);
  }
  return bVar13;
}

Assistant:

bool ObjectIdentifier::ToString(std::string & out) const
{
    // If possible, just look it up in our table
    const char* szOid = this->GetOidString();

    if (szOid != nullptr)
	{
		out = szOid;
	}
        
	std::string tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
	{
		return false;
	}
		
	if (value[0] < 40)
	{
		tmp = "0";
		tmp += "." + std::to_string(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = "1";
		tmp += "." + std::to_string(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = "2";
		tmp += "." + std::to_string(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += "." + std::to_string(node);
	}

	out.swap(tmp);
	return true;
}